

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O2

string * __thiscall
arangodb::velocypack::HexDump::toString_abi_cxx11_(string *__return_storage_ptr__,HexDump *this)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             this->length / (ulong)(long)this->valuesPerLine +
             ((this->separator)._M_string_length + this->length) * 4 + 1);
  puVar1 = this->data;
  puVar3 = puVar1 + this->length;
  for (; puVar1 < puVar3; puVar1 = puVar1 + 1) {
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->separator);
      if (iVar2 == this->valuesPerLine && 0 < this->valuesPerLine) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,'\n');
        iVar2 = 0;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&this->header);
    appendHex(__return_storage_ptr__,*puVar1);
    iVar2 = iVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HexDump::toString() const {
  std::string result;
  result.reserve(4 * (length + separator.size()) + (length / valuesPerLine) +
                 1);

  uint8_t const* p = data;
  uint8_t const* e = p + length;
  int current = 0;
  while (p < e) {
    if (current != 0) {
      result.append(separator);

      if (valuesPerLine > 0 && current == valuesPerLine) {
        result.push_back('\n');
        current = 0;
      }
    }

    result.append(header);
    appendHex(result, *p++);
    ++current;
  }

  return result;
}